

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O3

void biffnd(bifcxdef *ctx,int argc)

{
  uchar uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort *puVar4;
  undefined8 uVar5;
  anon_union_8_4_1dda36f5_for_runsv aVar6;
  undefined2 uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  runcxdef *prVar11;
  runsdef *prVar12;
  int iVar13;
  uint uVar14;
  dattyp typ;
  size_t __n;
  uint uVar15;
  ushort *puVar16;
  runsdef val;
  runsdef local_48;
  ushort *local_38;
  
  prVar11 = ctx->bifcxrun;
  uVar1 = prVar11->runcxsp[-1].runstyp;
  prVar12 = prVar11->runcxsp + -1;
  if (uVar1 == '\a') {
    prVar11->runcxsp = prVar12;
    prVar11 = ctx->bifcxrun;
    if (prVar12->runstyp != '\a') {
      prVar11->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3fc);
    }
    prVar12 = prVar11->runcxsp;
    puVar16 = (ushort *)(prVar12->runsv).runsvstr;
    uVar2 = *puVar16;
    prVar11->runcxsp = prVar12 + -1;
    uVar5._0_1_ = prVar12[-1].runstyp;
    uVar5._1_7_ = *(undefined7 *)&prVar12[-1].field_0x1;
    aVar6 = prVar12[-1].runsv;
    typ = 5;
    iVar13 = uVar2 - 2;
    local_48._0_8_ = uVar5;
    if (iVar13 == 0) {
      uVar14 = 1;
    }
    else {
      puVar16 = puVar16 + 1;
      local_48.runsv.runsvobj = aVar6.runsvobj;
      uVar7 = local_48.runsv.runsvobj;
      local_38 = (ushort *)(aVar6.runsvnum + 2);
      uVar14 = 1;
      local_48.runsv = aVar6;
      do {
        puVar4 = (ushort *)((long)puVar16 + 1);
        uVar9 = datsiz((uint)(byte)*puVar16,puVar4);
        if ((uchar)uVar5 == (byte)*puVar16) {
          switch((uchar)uVar5) {
          case '\x01':
            if ((ushort *)aVar6.runsvnum != (ushort *)(long)*(int *)puVar4) goto LAB_0020c404;
            break;
          case '\x02':
          case '\n':
          case '\r':
            if (*puVar4 != uVar7) goto LAB_0020c404;
            break;
          case '\x03':
          case '\a':
            if ((*puVar4 != *(ushort *)aVar6.runsvstr) ||
               (iVar10 = bcmp((byte *)((long)puVar16 + 3),local_38,(ulong)*puVar4 - 2), iVar10 != 0)
               ) goto LAB_0020c404;
          }
          typ = 1;
          goto LAB_0020c442;
        }
LAB_0020c404:
        uVar14 = uVar14 + 1;
        puVar16 = (ushort *)((long)puVar16 + (long)(int)(uVar9 + 1));
        iVar13 = iVar13 - (uVar9 + 1);
      } while (iVar13 != 0);
      typ = 5;
    }
LAB_0020c442:
    local_48.runsv.runsvnum._4_4_ = 0;
    local_48.runsv.runsvnum._0_4_ = uVar14;
    runpush(ctx->bifcxrun,typ,&local_48);
    return;
  }
  if (uVar1 != '\x03') {
    prVar11->runcxerr->errcxptr->erraav[0].errastr = "find";
    ctx->bifcxrun->runcxerr->errcxptr->erraac = 1;
    runsign(ctx->bifcxrun,0x3ff);
  }
  prVar11->runcxsp = prVar12;
  prVar11 = ctx->bifcxrun;
  if (prVar12->runstyp == '\x03') {
    prVar12 = prVar11->runcxsp;
    puVar16 = (ushort *)(prVar12->runsv).runsvstr;
    uVar2 = *puVar16;
    prVar11->runcxsp = prVar12 + -1;
    prVar11 = ctx->bifcxrun;
    if (prVar12[-1].runstyp == '\x03') {
      puVar4 = (ushort *)(prVar11->runcxsp->runsv).runsvstr;
      uVar3 = *puVar4;
      typ = 5;
      uVar15 = 1;
      uVar14 = uVar15;
      if (uVar3 <= uVar2) {
        __n = (ulong)uVar3 - 2;
        puVar16 = puVar16 + 1;
        iVar10 = (int)__n;
        uVar14 = (uint)uVar2 - iVar10;
        iVar13 = uVar2 - 1;
        do {
          iVar8 = bcmp(puVar16,puVar4 + 1,__n);
          if (iVar8 == 0) {
            typ = 1;
            uVar14 = uVar15;
            goto LAB_0020c442;
          }
          puVar16 = (ushort *)((long)puVar16 + 1);
          uVar15 = uVar15 + 1;
          iVar13 = iVar13 + -1;
        } while (iVar10 < iVar13);
        typ = 5;
      }
      goto LAB_0020c442;
    }
  }
  prVar11->runcxerr->errcxptr->erraac = 0;
  runsign(ctx->bifcxrun,0x3ef);
}

Assistant:

void biffnd(bifcxdef *ctx, int argc)
{
    uchar   *p1, *p2;
    int      len1, len2;
    int      outv;
    runsdef  val;
    int      typ;
    int      siz;
    
    bifcntargs(ctx, 2, argc);
    switch(runtostyp(ctx->bifcxrun))
    {
    case DAT_SSTRING:
        p1 = runpopstr(ctx->bifcxrun);
        len1 = osrp2(p1) - 2;
        p1 += 2;
        
        p2 = runpopstr(ctx->bifcxrun);
        len2 = osrp2(p2) - 2;
        p2 += 2;

        /* look for p2 within p1 */
        for (typ = DAT_NIL, outv = 1 ; len1 >= len2 ; ++p1, --len1, ++outv)
        {
            if (!memcmp(p1, p2, (size_t)len2))
            {
                typ = DAT_NUMBER;           /* use number in outv after all */
                break;                        /* that's it - we've found it */
            }
        }
        break;
        
    case DAT_LIST:
        p1 = runpoplst(ctx->bifcxrun);
        len1 = osrp2(p1) - 2;
        p1 += 2;

        /* get second item:  any old datatype */
        runpop(ctx->bifcxrun, &val);
        
        for (typ = DAT_NIL, outv = 1 ; len1 ; ++outv, p1 += siz, len1 -= siz)
        {
            siz = datsiz(*p1, p1 + 1) + 1;      /* get size of this element */
            if (val.runstyp != *p1) continue;          /* types don't match */
            
            switch(val.runstyp)
            {
            case DAT_NUMBER:
                if (val.runsv.runsvnum != osrp4s(p1 + 1)) continue;
                break;
                
            case DAT_SSTRING:
            case DAT_LIST:
                if (osrp2(p1 + 1) != osrp2(val.runsv.runsvstr) ||
                    memcmp(p1 + 3, val.runsv.runsvstr + 2,
                           (size_t)(osrp2(p1 + 1) - 2)))
                    continue;
                break;
                
            case DAT_PROPNUM:
                if (osrp2(p1 + 1) != val.runsv.runsvprp) continue;
                break;
                
            case DAT_OBJECT:
            case DAT_FNADDR:
                if (osrp2(p1 + 1) != val.runsv.runsvobj) continue;
                break;
                
            default:
                break;
            }
            
            /* if we got here, it means we found a match */
            typ = DAT_NUMBER;                      /* use the value in outv */
            break;                            /* that's it - we've found it */
        }
        break;
        
    default:
        runsig1(ctx->bifcxrun, ERR_INVTBIF, ERRTSTR, "find");
    }
    
    /* push the value given by typ and outv */
    val.runsv.runsvnum = outv;
    runpush(ctx->bifcxrun, typ, &val);
}